

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

int fe_read_frame_int16(fe_t *fe,int16 *in,int32 len)

{
  ushort *puVar1;
  int16 *piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (fe->frame_size < len) {
    len = (int)fe->frame_size;
  }
  memcpy(fe->spch,in,(long)len * 2);
  if (0 < len && fe->swap != '\0') {
    piVar2 = fe->spch;
    uVar5 = 0;
    do {
      puVar1 = (ushort *)(piVar2 + uVar5);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  if (0 < len && fe->dither != '\0') {
    uVar5 = 0;
    do {
      uVar4 = genrand_int31();
      fe->spch[uVar5] = fe->spch[uVar5] + (ushort)((uVar4 & 3) == 0);
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  iVar3 = fe_spch_to_frame(fe,len);
  return iVar3;
}

Assistant:

int
fe_read_frame_int16(fe_t * fe, int16 const *in, int32 len)
{
    int i;

    if (len > fe->frame_size)
        len = fe->frame_size;

    /* Read it into the raw speech buffer. */
    memcpy(fe->spch, in, len * sizeof(*in));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[i] += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, len);
}